

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

LexChar lex_more(LexState *ls)

{
  byte *pbVar1;
  char *p;
  size_t sz;
  LexState *ls_local;
  
  sz = (size_t)ls;
  pbVar1 = (byte *)(*ls->rfunc)(ls->L,ls->rdata,(size_t *)&p);
  if ((pbVar1 == (byte *)0x0) || (p == (char *)0x0)) {
    ls_local._4_4_ = 0xffffffff;
  }
  else {
    if ((char *)0x7ffffeff < p) {
      if (p != (char *)0xffffffffffffffff) {
        lj_err_mem(*(lua_State **)(sz + 8));
      }
      p = (char *)(-(long)pbVar1 - 1);
      if ((char *)0x7ffffeff < p) {
        p = (char *)0x7ffffeff;
      }
      *(undefined4 *)(sz + 0xb0) = 1;
    }
    *(byte **)(sz + 0x28) = pbVar1 + (long)p;
    *(byte **)(sz + 0x20) = pbVar1 + 1;
    ls_local._4_4_ = (uint)*pbVar1;
  }
  return ls_local._4_4_;
}

Assistant:

static LJ_NOINLINE LexChar lex_more(LexState *ls)
{
  size_t sz;
  const char *p = ls->rfunc(ls->L, ls->rdata, &sz);
  if (p == NULL || sz == 0) return LEX_EOF;
  if (sz >= LJ_MAX_BUF) {
    if (sz != ~(size_t)0) lj_err_mem(ls->L);
    sz = ~(uintptr_t)0 - (uintptr_t)p;
    if (sz >= LJ_MAX_BUF) sz = LJ_MAX_BUF-1;
    ls->endmark = 1;
  }
  ls->pe = p + sz;
  ls->p = p + 1;
  return (LexChar)(uint8_t)p[0];
}